

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O3

unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
__thiscall duckdb::BaseReservoirSampling::Copy(BaseReservoirSampling *this)

{
  double dVar1;
  idx_t iVar2;
  BaseReservoirSampling *this_00;
  pointer pBVar3;
  pointer *__ptr;
  long in_RSI;
  
  this_00 = (BaseReservoirSampling *)operator_new(0x78);
  BaseReservoirSampling(this_00,1);
  *(BaseReservoirSampling **)&(this->random).super_RandomEngine.lock.super___mutex_base._M_mutex =
       this_00;
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  ::std::
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>::
  operator=(&(pBVar3->reservoir_weights).c,
            (vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             *)(in_RSI + 0x58));
  iVar2 = *(idx_t *)(in_RSI + 0x30);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  pBVar3->next_index_to_sample = iVar2;
  dVar1 = *(double *)(in_RSI + 0x38);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  pBVar3->min_weight_threshold = dVar1;
  iVar2 = *(idx_t *)(in_RSI + 0x40);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  pBVar3->min_weighted_entry_index = iVar2;
  iVar2 = *(idx_t *)(in_RSI + 0x48);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  pBVar3->num_entries_to_skip_b4_next_sample = iVar2;
  iVar2 = *(idx_t *)(in_RSI + 0x50);
  pBVar3 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  pBVar3->num_entries_seen_total = iVar2;
  return (unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          )(unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
            )this;
}

Assistant:

unique_ptr<BaseReservoirSampling> BaseReservoirSampling::Copy() {
	auto ret = make_uniq<BaseReservoirSampling>(1);
	ret->reservoir_weights = reservoir_weights;
	ret->next_index_to_sample = next_index_to_sample;
	ret->min_weight_threshold = min_weight_threshold;
	ret->min_weighted_entry_index = min_weighted_entry_index;
	ret->num_entries_to_skip_b4_next_sample = num_entries_to_skip_b4_next_sample;
	ret->num_entries_seen_total = num_entries_seen_total;
	return ret;
}